

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZFront.cpp
# Opt level: O0

void __thiscall
TPZFront<std::complex<double>_>::PrintGlobal
          (TPZFront<std::complex<double>_> *this,char *name,ostream *out)

{
  ostream *poVar1;
  ostream *in_RDX;
  char *in_RSI;
  
  poVar1 = std::operator<<(in_RDX,in_RSI);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(in_RDX,"Not implemented in the abstract Class !");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(in_RDX,"Try one of the subclasses");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void TPZFront<TVar>::PrintGlobal(const char *name, std::ostream& out){
	out << name << endl;
	/*
	 int i, j;
	 for(i=0;i<fLocal.NElements();i++){
	 if(fLocal[i]!=-1) out << i << " ";
	 }
	 out << endl;
	 for(i=0;i<fLocal.NElements();i++){
	 if(fLocal[i]==-1) continue;
	 for(j=0;j<fLocal.NElements();j++){
	 if(fLocal[j]==-1) continue;
	 out << Element(fLocal[i],fLocal[j]) << " ";
	 }
	 out << endl;
	 }
	 out << endl;
	 */
	out << "Not implemented in the abstract Class !" << endl;
	out << "Try one of the subclasses" << endl;
}